

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O1

void __thiscall
cmCTestCVS::WriteXMLDirectory(cmCTestCVS *this,cmXMLWriter *xml,string *path,Directory *dir)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pRVar3;
  pointer pRVar4;
  long *plVar5;
  _Base_ptr p_Var6;
  size_type *psVar7;
  Revision *this_00;
  string branchFlag;
  File f;
  vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> revisions;
  string full;
  string local_d0;
  string *local_b0;
  File local_a8;
  vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> local_88;
  value_type *local_68;
  string local_60;
  _Rb_tree_node_base *local_40;
  char *local_38;
  
  local_38 = "/";
  if (path->_M_string_length == 0) {
    local_38 = "";
  }
  paVar1 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  local_b0 = path;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Directory","");
  cmXMLWriter::StartElement(xml,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Name","");
  cmXMLWriter::StartElement(xml,&local_d0);
  cmXMLWriter::Content<std::__cxx11::string>(xml,local_b0);
  cmXMLWriter::EndElement(xml);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  ComputeBranchFlag(&local_d0,this,local_b0);
  local_88.super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>._M_impl.
  super__Vector_impl_data._M_start = (Revision *)0x0;
  local_88.super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>._M_impl.
  super__Vector_impl_data._M_finish = (Revision *)0x0;
  local_88.super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var6 = (dir->
           super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus>_>_>
           )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_40 = &(dir->
              super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus>_>_>
              )._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var6 != local_40) {
    local_68 = &(this->super_cmCTestVC).Unknown;
    do {
      pcVar2 = (local_b0->_M_dataplus)._M_p;
      local_a8._0_8_ = &local_a8.PriorRev;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a8,pcVar2,pcVar2 + local_b0->_M_string_length);
      std::__cxx11::string::append((char *)&local_a8);
      plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_a8,*(ulong *)(p_Var6 + 1));
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_60.field_2._M_allocated_capacity = *psVar7;
        local_60.field_2._8_8_ = plVar5[3];
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      }
      else {
        local_60.field_2._M_allocated_capacity = *psVar7;
        local_60._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_60._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((Revision **)local_a8._0_8_ != &local_a8.PriorRev) {
        operator_delete((void *)local_a8._0_8_,
                        (ulong)((long)&((local_a8.PriorRev)->Rev)._M_dataplus._M_p + 1));
      }
      pRVar4 = local_88.
               super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>._M_impl
               .super__Vector_impl_data._M_finish;
      pRVar3 = local_88.
               super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>._M_impl
               .super__Vector_impl_data._M_start;
      this_00 = local_88.
                super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (local_88.super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_88.super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        do {
          cmCTestVC::Revision::~Revision(this_00);
          this_00 = this_00 + 1;
        } while (this_00 != pRVar4);
        local_88.super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>.
        _M_impl.super__Vector_impl_data._M_finish = pRVar3;
      }
      if (p_Var6[2]._M_color != _S_red) {
        std::vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::push_back
                  (&local_88,local_68);
      }
      LoadRevisions(this,&local_60,local_d0._M_dataplus._M_p,&local_88);
      std::vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::resize
                (&local_88,2,local_68);
      local_a8.Status = p_Var6[2]._M_color;
      local_a8.Rev = local_88.
                     super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      local_a8.PriorRev =
           local_88.super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>.
           _M_impl.super__Vector_impl_data._M_start + 1;
      cmCTestVC::WriteXMLEntry
                (&this->super_cmCTestVC,xml,local_b0,(string *)(p_Var6 + 1),&local_60,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != local_40);
  }
  cmXMLWriter::EndElement(xml);
  std::vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCTestCVS::WriteXMLDirectory(cmXMLWriter& xml, std::string const& path,
                                   Directory const& dir)
{
  const char* slash = path.empty() ? "" : "/";
  xml.StartElement("Directory");
  xml.Element("Name", path);

  // Lookup the branch checked out in the working tree.
  std::string branchFlag = this->ComputeBranchFlag(path);

  // Load revisions and write an entry for each file in this directory.
  std::vector<Revision> revisions;
  for (auto const& fi : dir) {
    std::string full = path + slash + fi.first;

    // Load two real or unknown revisions.
    revisions.clear();
    if (fi.second != PathUpdated) {
      // For local modifications the current rev is unknown and the
      // prior rev is the latest from cvs.
      revisions.push_back(this->Unknown);
    }
    this->LoadRevisions(full, branchFlag.c_str(), revisions);
    revisions.resize(2, this->Unknown);

    // Write the entry for this file with these revisions.
    File f(fi.second, revisions.data(), revisions.data() + 1);
    this->WriteXMLEntry(xml, path, fi.first, full, f);
  }
  xml.EndElement(); // Directory
}